

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall
merlin::graph::triangulate
          (graph *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *ordering)

{
  ulong uVar1;
  index i_00;
  bool bVar2;
  pointer __n;
  const_reference pvVar3;
  reference pvVar4;
  my_set<merlin::edge_id> *this_00;
  reference peVar5;
  size_type sVar6;
  int local_b4;
  int local_b0;
  int k;
  int j;
  int m;
  index ni;
  __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
  local_98;
  const_iterator si;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tmp;
  my_set<merlin::edge_id> *ns;
  size_t pos;
  size_t var;
  size_t i_1;
  size_t i;
  allocator<unsigned_long> local_39;
  undefined1 local_38 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> position;
  size_t n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *ordering_local;
  graph *this_local;
  
  __n = (pointer)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(ordering);
  position.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __n;
  std::allocator<unsigned_long>::allocator(&local_39);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,(size_type)__n,
             &local_39);
  std::allocator<unsigned_long>::~allocator(&local_39);
  for (i_1 = 0; i_1 < position.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage; i_1 = i_1 + 1) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](ordering,i_1);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,*pvVar3);
    *pvVar4 = i_1;
  }
  for (var = 0; var < position.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage; var = var + 1) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](ordering,var);
    sVar6 = *pvVar3;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,sVar6);
    uVar1 = *pvVar4;
    this_00 = neighbors(this,sVar6);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&si);
    local_98._M_current = (edge_id *)my_set<merlin::edge_id>::begin(this_00);
    while( true ) {
      ni = (index)my_set<merlin::edge_id>::end(this_00);
      bVar2 = __gnu_cxx::operator!=
                        (&local_98,
                         (__normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
                          *)&ni);
      if (!bVar2) break;
      peVar5 = __gnu_cxx::
               __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
               ::operator*(&local_98);
      _j = peVar5->second;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,_j);
      if (uVar1 < *pvVar4) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&si,
                   (value_type_conflict *)&j);
      }
      __gnu_cxx::
      __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
      ::operator++(&local_98);
    }
    sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&si);
    for (local_b0 = 0; local_b4 = local_b0, local_b0 < (int)sVar6 + -1; local_b0 = local_b0 + 1) {
      while (local_b4 = local_b4 + 1, local_b4 < (int)sVar6) {
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&si,
                            (long)local_b0);
        i_00 = *pvVar4;
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&si,
                            (long)local_b4);
        add_edge(this,i_00,*pvVar4);
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&si);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
  return;
}

Assistant:

void graph::triangulate(const std::vector<size_t>& ordering) {

	// set the position map
	size_t n = ordering.size();
	std::vector<size_t> position(n);
	for (size_t i = 0; i < n; ++i) {
		position[ordering[i]] = i;
	}

	// triangulate the graph
	for (size_t i = 0; i < n; ++i) {
		size_t var = ordering[i];
		size_t pos = position[var];

		const my_set<edge_id>& ns = neighbors(var);
		std::vector<size_t> tmp;
		for (my_set<edge_id>::const_iterator si = ns.begin(); si != ns.end(); ++si) {
			index ni = (*si).second;
			if (position[ni] > pos) {
				tmp.push_back(ni);
			}
		}

		// connect the earlier neighbors
		int m = (int)tmp.size();
		for (int j = 0; j < m-1; ++j) {
			for (int k = j+1; k < m; ++k) {
				add_edge(tmp[j], tmp[k]);
			}
		}
	}
}